

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int isValid733Integer(uchar *p)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((*p == p[7]) && (p[1] == p[6])) && (p[2] == p[5])) {
    uVar1 = (uint)(p[3] == p[4]);
  }
  return uVar1;
}

Assistant:

static int
isValid733Integer(const unsigned char *p)
{
	return (p[0] == p[7]
		&& p[1] == p[6]
		&& p[2] == p[5]
		&& p[3] == p[4]);
}